

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_3::SingularStringView::GenerateMergingCode
          (SingularStringView *this,Printer *p)

{
  if ((this->super_FieldGeneratorBase).is_oneof_ == true) {
    io::Printer::Emit(p,0x97,
                      "\n        if (oneof_needs_init) {\n          _this->$field_$.InitDefault();\n        }\n        _this->$field_$.Set(from._internal_$name$(), arena);\n      "
                     );
    return;
  }
  io::Printer::Emit(p,0x45,"\n        _this->_internal_set_$name$(from._internal_$name$());\n      "
                   );
  return;
}

Assistant:

void GenerateMergingCode(io::Printer* p) const override {
    if (is_oneof()) {
      p->Emit(R"cc(
        if (oneof_needs_init) {
          _this->$field_$.InitDefault();
        }
        _this->$field_$.Set(from._internal_$name$(), arena);
      )cc");
    } else {
      p->Emit(R"cc(
        _this->_internal_set_$name$(from._internal_$name$());
      )cc");
    }
  }